

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparate
          (BlendMaskStateMachine *this,GLenum src_rgb,GLenum dst_rgb,GLenum src_a,GLenum dst_a)

{
  size_type sVar1;
  reference pvVar2;
  uint local_24;
  uint i;
  GLenum dst_a_local;
  GLenum src_a_local;
  GLenum dst_rgb_local;
  GLenum src_rgb_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->blendFuncSeparate)(src_rgb,dst_rgb,src_a,dst_a);
  local_24 = 0;
  while( true ) {
    sVar1 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::size(&this->state);
    if (sVar1 <= local_24) break;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_24);
    pvVar2->func_src_rgb = src_rgb;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_24);
    pvVar2->func_src_a = src_a;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_24);
    pvVar2->func_dst_rgb = dst_rgb;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_24);
    pvVar2->func_dst_a = dst_a;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparate(glw::GLenum src_rgb, glw::GLenum dst_rgb,
																		 glw::GLenum src_a, glw::GLenum dst_a)
{
	// all draw buffers
	gl.blendFuncSeparate(src_rgb, dst_rgb, src_a, dst_a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].func_src_rgb = src_rgb;
		state[i].func_src_a   = src_a;
		state[i].func_dst_rgb = dst_rgb;
		state[i].func_dst_a   = dst_a;
	}
}